

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O0

WOPNFile * WOPN_LoadBankFromMem(void *mem,size_t length,int *error)

{
  uint16_t melodic_banks;
  uint16_t percussive_banks;
  int iVar1;
  WOPNInstrument *ins;
  uint8_t auStack_5f [2];
  byte local_5d;
  uint16_t insSize;
  undefined1 uStack_5a;
  uint8_t head [5];
  uint16_t bankslots_sizes [2];
  WOPNBank *bankslots [2];
  uint8_t *cursor;
  ushort local_38;
  ushort local_36;
  uint16_t count_percussive_banks;
  uint16_t count_melodic_banks;
  uint16_t version;
  uint16_t k;
  uint16_t j;
  uint16_t i;
  WOPNFile *outFile;
  int *error_local;
  size_t length_local;
  void *mem_local;
  
  local_38 = 0;
  if (mem == (void *)0x0) {
    WOPN_Free((WOPNFile *)0x0);
    if (error != (int *)0x0) {
      *error = 6;
    }
    mem_local = (void *)0x0;
  }
  else if (length < 0xb) {
    WOPN_Free((WOPNFile *)0x0);
    if (error != (int *)0x0) {
      *error = 2;
    }
    mem_local = (void *)0x0;
  }
  else {
    iVar1 = memcmp(mem,wopn2_magic1,0xb);
    if (iVar1 == 0) {
      local_38 = 1;
    }
    else {
      iVar1 = memcmp(mem,wopn2_magic2,0xb);
      if (iVar1 != 0) {
        WOPN_Free((WOPNFile *)0x0);
        if (error != (int *)0x0) {
          *error = 1;
        }
        return (WOPNFile *)0x0;
      }
    }
    bankslots[1] = (WOPNBank *)((long)mem + 0xb);
    error_local = (int *)(length - 0xb);
    if (local_38 == 0) {
      if (error_local < (int *)0x2) {
        WOPN_Free((WOPNFile *)0x0);
        if (error != (int *)0x0) {
          *error = 2;
        }
        return (WOPNFile *)0x0;
      }
      local_38 = toUint16LE((uint8_t *)bankslots[1]);
      if (2 < local_38) {
        WOPN_Free((WOPNFile *)0x0);
        if (error != (int *)0x0) {
          *error = 4;
        }
        return (WOPNFile *)0x0;
      }
      bankslots[1] = (WOPNBank *)((long)mem + 0xd);
      error_local = (int *)(length - 0xd);
    }
    if (error_local < (int *)0x5) {
      WOPN_Free((WOPNFile *)0x0);
      if (error != (int *)0x0) {
        *error = 2;
      }
      mem_local = (void *)0x0;
    }
    else {
      unique0x00011f80 = *(undefined4 *)bankslots[1]->bank_name;
      local_5d = bankslots[1]->bank_name[4];
      melodic_banks = toUint16BE((uint8_t *)((long)&ins + 7));
      percussive_banks = toUint16BE(auStack_5f);
      bankslots[1] = (WOPNBank *)(bankslots[1]->bank_name + 5);
      error_local = (int *)((long)error_local + -5);
      mem_local = WOPN_Init(melodic_banks,percussive_banks);
      if ((WOPNFile *)mem_local == (WOPNFile *)0x0) {
        WOPN_Free((WOPNFile *)0x0);
        if (error != (int *)0x0) {
          *error = 5;
        }
        mem_local = (void *)0x0;
      }
      else {
        ((WOPNFile *)mem_local)->version = local_38;
        ((WOPNFile *)mem_local)->lfo_freq = local_5d & 0xf;
        if (1 < local_38) {
          ((WOPNFile *)mem_local)->chip_type = (byte)((int)(uint)local_5d >> 4) & 1;
        }
        ((WOPNFile *)mem_local)->volume_model = '\0';
        insSize = melodic_banks;
        stack0xffffffffffffffa8 = ((WOPNFile *)mem_local)->banks_melodic;
        _uStack_5a = percussive_banks;
        if (1 < local_38) {
          for (count_melodic_banks = 0; count_melodic_banks < 2;
              count_melodic_banks = count_melodic_banks + 1) {
            for (count_percussive_banks = 0;
                count_percussive_banks < (&insSize)[count_melodic_banks];
                count_percussive_banks = count_percussive_banks + 1) {
              if (error_local < (int *)0x22) {
                WOPN_Free((WOPNFile *)mem_local);
                if (error != (int *)0x0) {
                  *error = 2;
                }
                return (WOPNFile *)0x0;
              }
              strncpy((char *)(*(long *)(head + (ulong)count_melodic_banks * 8 + 1) +
                              (ulong)count_percussive_banks * 0x2424),bankslots[1]->bank_name,0x20);
              *(undefined1 *)
               (*(long *)(head + (ulong)count_melodic_banks * 8 + 1) +
                (ulong)count_percussive_banks * 0x2424 + 0x20) = 0;
              *(char *)(*(long *)(head + (ulong)count_melodic_banks * 8 + 1) +
                        (ulong)count_percussive_banks * 0x2424 + 0x21) =
                   bankslots[1]->bank_name[0x20];
              *(uint8_t *)
               (*(long *)(head + (ulong)count_melodic_banks * 8 + 1) +
                (ulong)count_percussive_banks * 0x2424 + 0x22) = bankslots[1]->bank_midi_lsb;
              bankslots[1] = (WOPNBank *)&bankslots[1]->bank_midi_msb;
              error_local = (int *)((long)error_local + -0x22);
            }
          }
        }
        if (local_38 < 2) {
          ins._4_2_ = 0x41;
        }
        else {
          ins._4_2_ = 0x45;
        }
        for (count_melodic_banks = 0; count_melodic_banks < 2;
            count_melodic_banks = count_melodic_banks + 1) {
          if (error_local <
              (int *)((long)(int)((uint)ins._4_2_ << 7) * (ulong)(&insSize)[count_melodic_banks])) {
            WOPN_Free((WOPNFile *)mem_local);
            if (error != (int *)0x0) {
              *error = 2;
            }
            return (WOPNFile *)0x0;
          }
          for (count_percussive_banks = 0; count_percussive_banks < (&insSize)[count_melodic_banks];
              count_percussive_banks = count_percussive_banks + 1) {
            for (local_36 = 0; local_36 < 0x80; local_36 = local_36 + 1) {
              WOPN_parseInstrument
                        ((WOPNInstrument *)
                         (*(long *)(head + (ulong)count_melodic_banks * 8 + 1) +
                          (ulong)count_percussive_banks * 0x2424 + 0x24 + (ulong)local_36 * 0x48),
                         (uint8_t *)bankslots[1],local_38,'\x01');
              bankslots[1] = (WOPNBank *)(bankslots[1]->bank_name + (int)(uint)ins._4_2_);
              error_local = (int *)((long)error_local - (ulong)ins._4_2_);
            }
          }
        }
      }
    }
  }
  return (WOPNFile *)mem_local;
}

Assistant:

WOPNFile *WOPN_LoadBankFromMem(void *mem, size_t length, int *error)
{
    WOPNFile *outFile = NULL;
    uint16_t i = 0, j = 0, k = 0;
    uint16_t version = 0;
    uint16_t count_melodic_banks     = 1;
    uint16_t count_percussive_banks   = 1;
    uint8_t *cursor = (uint8_t *)mem;

    WOPNBank *bankslots[2];
    uint16_t  bankslots_sizes[2];

#define SET_ERROR(err) \
{\
    WOPN_Free(outFile);\
    if(error)\
    {\
        *error = err;\
    }\
}

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    if(!cursor)
    {
        SET_ERROR(WOPN_ERR_NULL_POINTER);
        return NULL;
    }

    {/* Magic number */
        if(length < 11)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        if(memcmp(cursor, wopn2_magic1, 11) == 0)
        {
            version = 1;
        }
        else if(memcmp(cursor, wopn2_magic2, 11) != 0)
        {
            SET_ERROR(WOPN_ERR_BAD_MAGIC);
            return NULL;
        }
        GO_FORWARD(11);
    }

    if (version == 0)
    {/* Version code */
        if(length < 2)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        version = toUint16LE(cursor);
        if(version > wopn_latest_version)
        {
            SET_ERROR(WOPN_ERR_NEWER_VERSION);
            return NULL;
        }
        GO_FORWARD(2);
    }

    {/* Header of WOPN */
        uint8_t head[5];
        if(length < 5)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        memcpy(head, cursor, 5);
        count_melodic_banks = toUint16BE(head);
        count_percussive_banks = toUint16BE(head + 2);
        GO_FORWARD(5);

        outFile = WOPN_Init(count_melodic_banks, count_percussive_banks);
        if(!outFile)
        {
            SET_ERROR(WOPN_ERR_OUT_OF_MEMORY);
            return NULL;
        }

        outFile->version      = version;
        outFile->lfo_freq     = head[4] & 0xf;
        if(version >= 2)
            outFile->chip_type = (head[4] >> 4) & 1;
        outFile->volume_model = 0;
    }

    bankslots_sizes[0] = count_melodic_banks;
    bankslots[0] = outFile->banks_melodic;
    bankslots_sizes[1] = count_percussive_banks;
    bankslots[1] = outFile->banks_percussive;

    if(version >= 2) /* Bank names and LSB/MSB titles */
    {
        for(i = 0; i < 2; i++)
        {
            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                if(length < 34)
                {
                    SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
                    return NULL;
                }
                strncpy(bankslots[i][j].bank_name, (const char*)cursor, 32);
                bankslots[i][j].bank_name[32] = '\0';
                bankslots[i][j].bank_midi_lsb = cursor[32];
                bankslots[i][j].bank_midi_msb = cursor[33];
                GO_FORWARD(34);
            }
        }
    }

    {/* Read instruments data */
        uint16_t insSize = 0;
        if(version > 1)
            insSize = WOPN_INST_SIZE_V2;
        else
            insSize = WOPN_INST_SIZE_V1;
        for(i = 0; i < 2; i++)
        {
            if(length < (insSize * 128) * (size_t)bankslots_sizes[i])
            {
                SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
                return NULL;
            }

            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                for(k = 0; k < 128; k++)
                {
                    WOPNInstrument *ins = &bankslots[i][j].ins[k];
                    WOPN_parseInstrument(ins, cursor, version, 1);
                    GO_FORWARD(insSize);
                }
            }
        }
    }

#undef GO_FORWARD
#undef SET_ERROR

    return outFile;
}